

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DArrayShadowGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = c->in[0].m_data[2];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  fVar2 = (float)(c->textures[0].tex1DArray)->m_width;
  fVar4 = c->in[1].m_data[0] * fVar2;
  fVar2 = fVar2 * c->in[2].m_data[0];
  uVar1 = -(uint)(-fVar4 <= fVar4);
  fVar4 = (float)(~uVar1 & (uint)-fVar4 | (uint)fVar4 & uVar1);
  uVar1 = -(uint)(-fVar2 <= fVar2);
  fVar2 = (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1);
  uVar1 = -(uint)(fVar2 <= fVar4);
  fVar2 = logf((float)(~uVar1 & (uint)fVar2 | uVar1 & (uint)fVar4));
  fVar3 = tcu::Texture1DArrayView::sampleCompareOffset
                    (&(c->textures[0].tex1DArray)->m_view,&c->textures[0].sampler,fVar3,s,t,
                     fVar2 * 1.442695,(p->offset).m_data[0]);
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

static void		evalTexture1DArrayShadowGradOffset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DArrayShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad1DArray(c), p.offset.x()); }